

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O0

qreal QHighDpiScaling::screenSubfactor(QPlatformScreen *screen)

{
  double *pdVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal screenFactor;
  QScreen *qScreen;
  qreal factor;
  const_iterator byNameIt;
  bool screenPropertyUsed;
  QString *in_stack_ffffffffffffff58;
  QPlatformScreen *in_stack_ffffffffffffff60;
  QPlatformScreen *in_stack_ffffffffffffff68;
  QScreen *in_stack_ffffffffffffff78;
  QPlatformScreen *local_70;
  undefined1 local_58 [24];
  piter local_40;
  byte local_29;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (QPlatformScreen *)0x3ff0000000000000;
  if (in_RDI == (long *)0x0) {
    local_70 = (QPlatformScreen *)0x3ff0000000000000;
  }
  else {
    local_29 = 0;
    if (m_screenFactorSet) {
      in_stack_ffffffffffffff78 = QPlatformScreen::screen(in_stack_ffffffffffffff60);
      if (in_stack_ffffffffffffff78 != (QScreen *)0x0) {
        QObject::property((char *)&local_28);
        in_stack_ffffffffffffff68 = (QPlatformScreen *)::QVariant::toReal((bool *)&local_28);
        ::QVariant::~QVariant(&local_28);
        if ((local_29 & 1) != 0) {
          local_70 = in_stack_ffffffffffffff68;
        }
      }
      if ((local_29 & 1) == 0) {
        local_40.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_40.d = (Data<QHashPrivate::Node<QString,_double>_> *)&DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*in_RDI + 0x90))(local_58);
        local_40 = (piter)QHash<QString,_double>::constFind
                                    ((QHash<QString,_double> *)in_stack_ffffffffffffff60,
                                     in_stack_ffffffffffffff58);
        QString::~QString((QString *)0x392a4e);
        QHash<QString,_double>::cend((QHash<QString,_double> *)in_stack_ffffffffffffff68);
        local_29 = QHash<QString,_double>::const_iterator::operator!=
                             ((const_iterator *)in_stack_ffffffffffffff68,
                              (const_iterator *)in_stack_ffffffffffffff60);
        if ((bool)local_29) {
          pdVar1 = QHash<QString,_double>::const_iterator::operator*((const_iterator *)0x392a8c);
          local_70 = (QPlatformScreen *)*pdVar1;
        }
      }
    }
    if (((local_29 & 1) == 0) && ((m_usePlatformPluginDpi & 1U) != 0)) {
      rawScaleFactor(local_70);
      local_70 = (QPlatformScreen *)roundScaleFactor((qreal)in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qreal)local_70;
}

Assistant:

qreal QHighDpiScaling::screenSubfactor(const QPlatformScreen *screen)
{
    auto factor = qreal(1.0);
    if (!screen)
        return factor;

    // Unlike the other code where factors are combined by multiplication,
    // factors from QT_SCREEN_SCALE_FACTORS takes precedence over the factor
    // computed from platform plugin DPI. The rationale is that the user is
    // setting the factor to override erroneous DPI values.
    bool screenPropertyUsed = false;
    if (m_screenFactorSet) {
        // Check if there is a factor set on the screen object or associated
        // with the screen name. These are mutually exclusive, so checking
        // order is not significant.
        if (auto qScreen = screen->screen()) {
            auto screenFactor = qScreen->property(scaleFactorProperty).toReal(&screenPropertyUsed);
            if (screenPropertyUsed)
                factor = screenFactor;
        }

        if (!screenPropertyUsed) {
            auto byNameIt = QHighDpiScaling::m_namedScreenScaleFactors.constFind(screen->name());
            if ((screenPropertyUsed = byNameIt != QHighDpiScaling::m_namedScreenScaleFactors.cend()))
                factor = *byNameIt;
        }
    }

    if (!screenPropertyUsed && m_usePlatformPluginDpi)
        factor = roundScaleFactor(rawScaleFactor(screen));

    return factor;
}